

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_286a9::FileSystemTest_testRecursiveRemoval_Test::TestBody
          (FileSystemTest_testRecursiveRemoval_Test *this)

{
  long *plVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  int *rhs;
  pointer *__ptr;
  __mode_t _Var5;
  char *in_R9;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Str;
  StringRef Filename_00;
  StringRef Str_00;
  error_code ec;
  AssertionResult gtest_ar__1;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  StatStruct statbuf;
  SmallString<256U> tempDir;
  SmallString<256U> dir;
  SmallString<256U> file;
  TmpDir rootTempDir;
  AssertHelper local_568;
  Child local_560;
  Child local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  Child local_540;
  Child local_538 [2];
  Child local_528;
  Child local_520 [2];
  Child local_510;
  AssertHelper local_508;
  Child local_500 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0 [8];
  SmallString<256U> local_470;
  Child local_360;
  undefined4 local_358;
  undefined4 uStack_354;
  Twine local_350 [10];
  Child local_250;
  undefined4 local_248;
  undefined4 uStack_244;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240 [16];
  TmpDir local_140;
  int iVar6;
  Child *pCVar7;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&local_140,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_250,&local_140);
  local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &local_470.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_470,local_250.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_250.twine)->LHS)->_M_local_buf + CONCAT44(uStack_244,local_248));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.twine != local_240) {
    operator_delete(local_250.twine,local_240[0]._M_allocated_capacity + 1);
  }
  pCVar7 = &local_250;
  llvm::Twine::Twine((Twine *)pCVar7,"root");
  llvm::Twine::Twine((Twine *)&local_360,"");
  llvm::Twine::Twine((Twine *)local_500,"");
  llvm::Twine::Twine((Twine *)&local_560,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_470,(Twine *)pCVar7,(Twine *)&local_360,
             (Twine *)local_500,(Twine *)&local_560);
  _Var5 = (__mode_t)pCVar7;
  pcVar3 = llvm::SmallString<256U>::c_str(&local_470);
  llbuild::basic::sys::mkdir(pcVar3,_Var5);
  local_250.twine = (Twine *)local_240;
  local_248 = 0;
  uStack_244 = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_250,
             (char *)local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)((AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char>
                       *)local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                         super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                     (local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                     0xffffffff)));
  llvm::Twine::Twine((Twine *)&local_360,"test.txt");
  llvm::Twine::Twine((Twine *)local_500,"");
  llvm::Twine::Twine((Twine *)&local_560,"");
  llvm::Twine::Twine((Twine *)&local_528,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_250,(Twine *)&local_360,(Twine *)local_500,
             (Twine *)&local_560,(Twine *)&local_528);
  local_560.decUI = 0;
  local_558.twine = (Twine *)std::_V2::system_category();
  Filename.Length._0_4_ = local_248;
  Filename.Data = local_250.cString;
  Filename.Length._4_4_ = 0;
  local_510.twine = local_558.twine;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_360,Filename,(error_code *)&local_560,F_Text);
  local_528.character = local_560.decUI == 0;
  local_520[0].twine = (Twine *)0x0;
  if (local_560.decUI != 0) {
    testing::Message::Message((Message *)&local_540);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_500,(internal *)&local_528.character,(AssertionResult *)0x19ae70,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x4c,local_500[0].cString);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500[0].twine != local_4f0) {
      operator_delete(local_500[0].twine,local_4f0[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_540._4_4_,local_540.decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_540._4_4_,local_540.decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520[0].twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_520[0].character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_520[0].twine);
  }
  Str.Length = 0xd;
  Str.Data = "Hello, world!";
  iVar6 = 0x19a817;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_360,Str);
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&local_360,iVar6);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_360);
  local_360.twine = local_350;
  local_358 = 0;
  uStack_354 = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_360,
             (char *)local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)((AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char>
                       *)local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                         super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                     (local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                     0xffffffff)));
  pCVar7 = local_500;
  llvm::Twine::Twine((Twine *)pCVar7,"subdir");
  pcVar3 = "";
  llvm::Twine::Twine((Twine *)&local_560,"");
  llvm::Twine::Twine((Twine *)&local_528,"");
  llvm::Twine::Twine((Twine *)&local_540,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_360,(Twine *)pCVar7,(Twine *)&local_560,
             (Twine *)&local_528,(Twine *)&local_540);
  _Var5 = (__mode_t)pCVar7;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_360);
  llbuild::basic::sys::mkdir(pcVar4,_Var5);
  llvm::Twine::Twine((Twine *)local_500,"file_in_subdir.txt");
  llvm::Twine::Twine((Twine *)&local_560,"");
  llvm::Twine::Twine((Twine *)&local_528,"");
  llvm::Twine::Twine((Twine *)&local_540,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_360,(Twine *)local_500,(Twine *)&local_560,
             (Twine *)&local_528,(Twine *)&local_540);
  local_528.decUI = 0;
  local_520[0] = local_510;
  Filename_00.Length._0_4_ = local_358;
  Filename_00.Data = local_360.cString;
  Filename_00.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_500,Filename_00,(error_code *)&local_528,F_Text);
  local_540.character = local_528.decUI == 0;
  local_538[0].twine = (Twine *)0x0;
  if (local_528.decUI != 0) {
    testing::Message::Message((Message *)&local_568);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_560,(internal *)&local_540.character,(AssertionResult *)0x19ae70,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x59,(char *)CONCAT44(local_560._4_4_,local_560.decUI));
    testing::internal::AssertHelper::operator=(&local_508,(Message *)&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_560._4_4_,local_560.decUI) != &local_550) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_560._4_4_,local_560.decUI),
                      local_550._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_568.data_._4_4_,(int)local_568.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_568.data_._4_4_,(int)local_568.data_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538[0].twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_538[0].character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_538[0].twine);
  }
  Str_00.Length = 0xd;
  Str_00.Data = "Hello, world!";
  iVar6 = 0x19a817;
  llvm::raw_ostream::operator<<((raw_ostream *)local_500,Str_00);
  llvm::raw_fd_ostream::close((raw_fd_ostream *)local_500,iVar6);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_500);
  llbuild::basic::createLocalFileSystem();
  plVar1 = (long *)CONCAT44(local_528._4_4_,local_528.decUI);
  pcVar4 = llvm::SmallString<256U>::c_str(&local_470);
  std::__cxx11::string::string
            ((string *)&local_500[0].character,pcVar4,(allocator *)&local_560.character);
  cVar2 = (**(code **)(*plVar1 + 0x28))(plVar1,local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500[0].twine != local_4f0) {
    operator_delete(local_500[0].twine,local_4f0[0]._M_allocated_capacity + 1);
  }
  local_560.character = cVar2;
  local_558.twine = (Twine *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_540);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_500,(internal *)&local_560.character,(AssertionResult *)"result",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x60,local_500[0].cString);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500[0].twine != local_4f0) {
      operator_delete(local_500[0].twine,local_4f0[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_540._4_4_,local_540.decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_540._4_4_,local_540.decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_558.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_558.twine);
  }
  local_540.decUI = 0xffffffff;
  pcVar4 = llvm::SmallString<256U>::c_str(&local_470);
  local_568.data_._0_4_ = llbuild::basic::sys::stat(pcVar4,(stat *)local_500);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_560.character,"-1","sys::stat(tempDir.c_str(), &statbuf)",
             &local_540.decI,(int *)&local_568);
  if (local_560.character == '\0') {
    testing::Message::Message((Message *)&local_540);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558.twine !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((_Alloc_hider *)&(local_558.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    if ((long *)CONCAT44(local_540._4_4_,local_540.decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_540._4_4_,local_540.decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_558.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_558.twine);
  }
  local_540.decUI = 2;
  rhs = __errno_location();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_560.character,"2","(*__errno_location ())",&local_540.decI,rhs);
  if (local_560.character == '\0') {
    testing::Message::Message((Message *)&local_540);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558.twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)&(local_558.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    if ((long *)CONCAT44(local_540._4_4_,local_540.decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_540._4_4_,local_540.decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_558.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_558.twine);
  }
  if ((long *)CONCAT44(local_528._4_4_,local_528.decUI) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_528._4_4_,local_528.decUI) + 8))();
  }
  if (local_360.twine != local_350) {
    free(local_360.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.twine != local_240) {
    free(local_250.twine);
  }
  if ((SmallVectorStorage<char,_256U> *)
      local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX !=
      &local_470.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>) {
    free(local_470.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  llbuild::TmpDir::~TmpDir(&local_140);
  return;
}

Assistant:

TEST(FileSystemTest, testRecursiveRemoval) {
  TmpDir rootTempDir(__func__);

  SmallString<256> tempDir { rootTempDir.str() };
  llvm::sys::path::append(tempDir, "root");
  sys::mkdir(tempDir.c_str());

  SmallString<256> file{ tempDir.str() };
  llvm::sys::path::append(file, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(file.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> dir{ tempDir.str() };
  llvm::sys::path::append(dir, "subdir");
  sys::mkdir(dir.c_str());

  llvm::sys::path::append(dir, "file_in_subdir.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(dir.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto fs = createLocalFileSystem();
  bool result = fs->remove(tempDir.c_str());
  EXPECT_TRUE(result);

  sys::StatStruct statbuf;
  EXPECT_EQ(-1, sys::stat(tempDir.c_str(), &statbuf));
  EXPECT_EQ(ENOENT, errno);
}